

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxIfStatement::Emit(FxIfStatement *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  int iVar2;
  ExpEmit EVar3;
  FxExpression *this_00;
  size_t loc;
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  
  yes.Array = (unsigned_long *)0x0;
  yes.Most = 0;
  yes.Count = 0;
  no.Array = (unsigned_long *)0x0;
  no.Most = 0;
  no.Count = 0;
  (*this->Condition->_vptr_FxExpression[10])
            (this->Condition,build,(ulong)(this->WhenTrue == (FxExpression *)0x0));
  if (this->WhenTrue != (FxExpression *)0x0) {
    VMFunctionBuilder::BackpatchListToHere(build,&yes);
    FxExpression::EmitStatement(this->WhenTrue,build);
  }
  this_00 = this->WhenFalse;
  if (this_00 != (FxExpression *)0x0) {
    loc = 0xffffffff;
    pFVar1 = this->WhenTrue;
    if (pFVar1 != (FxExpression *)0x0) {
      iVar2 = (*pFVar1->_vptr_FxExpression[7])(pFVar1);
      if ((char)iVar2 == '\0') {
        loc = VMFunctionBuilder::Emit(build,0x44,0);
      }
      VMFunctionBuilder::BackpatchListToHere(build,&no);
      this_00 = this->WhenFalse;
    }
    FxExpression::EmitStatement(this_00,build);
    if (loc != 0xffffffff) {
      VMFunctionBuilder::BackpatchToHere(build,loc);
    }
    if (this->WhenTrue != (FxExpression *)0x0) goto LAB_00518e66;
  }
  VMFunctionBuilder::BackpatchListToHere(build,&no);
LAB_00518e66:
  TArray<unsigned_long,_unsigned_long>::~TArray(&no);
  TArray<unsigned_long,_unsigned_long>::~TArray(&yes);
  EVar3.RegNum = 0;
  EVar3.RegType = 0x80;
  EVar3.RegCount = '\x01';
  EVar3.Konst = false;
  EVar3.Fixed = false;
  EVar3.Final = false;
  EVar3.Target = false;
  return EVar3;
}

Assistant:

ExpEmit FxIfStatement::Emit(VMFunctionBuilder *build)
{
	ExpEmit v;
	size_t jumpspot = ~0u;

	TArray<size_t> yes, no;
	Condition->EmitCompare(build, WhenTrue == nullptr, yes, no);

	if (WhenTrue != nullptr)
	{
		build->BackpatchListToHere(yes);
		WhenTrue->EmitStatement(build);
	}
	if (WhenFalse != nullptr)
	{
		if (WhenTrue != nullptr)
		{
			if (!WhenTrue->CheckReturn()) jumpspot = build->Emit(OP_JMP, 0);	// no need to emit a jump if the block returns.
			build->BackpatchListToHere(no);
		}
		WhenFalse->EmitStatement(build);
		if (jumpspot != ~0u) build->BackpatchToHere(jumpspot);
		if (WhenTrue == nullptr) build->BackpatchListToHere(no);
	}
	else
	{
		build->BackpatchListToHere(no);
	}
	return ExpEmit();
}